

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall Catch::Session::runInternal(Session *this)

{
  pointer pTVar1;
  undefined8 *puVar2;
  element_type *peVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *pvVar7;
  long lVar8;
  ulong uVar9;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar10;
  undefined4 extraout_var;
  long *plVar11;
  tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_> this_00;
  undefined4 extraout_var_00;
  undefined8 *puVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TestCase *testCase;
  pointer pTVar13;
  pointer *__ptr;
  __shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *__r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  string *psVar14;
  __uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  local_2f8;
  __shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *local_2f0;
  TestSpec testSpec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  ReusableStringStream testConfig;
  string filename;
  element_type *local_150;
  ulong local_130;
  IStreamingReporterPtr local_108;
  
  if (this->m_startupExceptions == false) {
    totals.assertions.failed._0_4_ = 0;
    if (((this->m_configData).showHelp == false) && ((this->m_configData).libIdentify == false)) {
      config(this);
      seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_IConfig);
      __r = &(this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>;
      if ((this->m_configData).filenamesAsTags == true) {
        local_2f0 = __r;
        pvVar7 = getAllTestCasesSorted
                           (&((((shared_ptr<Catch::Config> *)__r)->
                              super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                             ->super_IConfig);
        pTVar1 = (pvVar7->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pTVar13 = (pvVar7->
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                       _M_impl.super__Vector_impl_data._M_start; __r = local_2f0, pTVar13 != pTVar1;
            pTVar13 = pTVar13 + 1) {
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&tags,&(pTVar13->super_TestCaseInfo).tags);
          std::__cxx11::string::string
                    ((string *)&filename,(pTVar13->super_TestCaseInfo).lineInfo.file,
                     (allocator *)&testSpec);
          lVar8 = std::__cxx11::string::find_last_of((char *)&filename,0x15d715);
          if (lVar8 != -1) {
            std::__cxx11::string::erase((ulong)&filename,0);
            *filename._M_dataplus._M_p = '#';
          }
          uVar9 = std::__cxx11::string::rfind((char)&filename,0x2e);
          if (uVar9 != 0xffffffffffffffff) {
            std::__cxx11::string::erase((ulong)&filename,uVar9);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&tags,
                     &filename);
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&totals,&tags);
          setTags(&pTVar13->super_TestCaseInfo,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&totals);
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&totals);
          std::__cxx11::string::~string((string *)&filename);
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&tags);
        }
      }
      list((Catch *)&filename,(shared_ptr<Catch::Config> *)__r);
      if (filename._M_dataplus._M_p == (pointer)0x0) {
        pSVar10 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                  ::getInternal();
        iVar6 = (*(pSVar10->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar10);
        plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x20))
                                    ((long *)CONCAT44(extraout_var,iVar6));
        if (*plVar11 == plVar11[1]) {
          peVar3 = __r->_M_ptr;
          std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Catch::Config,void>
                    ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&filename,__r)
          ;
          anon_unknown_1::createReporter
                    ((anon_unknown_1 *)&local_2f8,&(peVar3->m_data).reporterName,
                     (IConfigPtr *)&filename);
        }
        else {
          this_00.
          super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
          .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                )operator_new(0x30);
          *(undefined ***)
           this_00.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               &PTR__ListeningReporter_0018ee88;
          (((Reporters *)
           ((long)this_00.
                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 8))->
          super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          *(pointer *)
           ((long)this_00.
                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x10) =
               (pointer)0x0;
          *(pointer *)
           ((long)this_00.
                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x18) =
               (pointer)0x0;
          (((IStreamingReporterPtr *)
           ((long)this_00.
                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x20))->
          _M_t).
          super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
          .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (IStreamingReporter *)0x0;
          ((ReporterPreferences *)
          ((long)this_00.
                 super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                 .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x28))->
          shouldRedirectStdOut = false;
          ((ReporterPreferences *)
          ((long)this_00.
                 super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                 .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x28))->
          shouldReportAllAssertions = true;
          local_2f8._M_t.
          super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
          .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
               (tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
               this_00.
               super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
               .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
          local_2f0 = __r;
          pSVar10 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                    ::getInternal();
          iVar6 = (*(pSVar10->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar10);
          puVar12 = (undefined8 *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x20))
                              ((long *)CONCAT44(extraout_var_00,iVar6));
          puVar2 = (undefined8 *)puVar12[1];
          for (puVar12 = (undefined8 *)*puVar12; __r = local_2f0, puVar12 != puVar2;
              puVar12 = puVar12 + 2) {
            plVar11 = (long *)*puVar12;
            std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<Catch::Config,void>
                      ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&tags,
                       local_2f0);
            ReporterConfig::ReporterConfig((ReporterConfig *)&filename,(IConfigPtr *)&tags);
            (**(code **)(*plVar11 + 0x10))(&testSpec,plVar11,&filename);
            std::
            vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
            ::
            emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                      ((vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                        *)((long)this_00.
                                 super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                 .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                 _M_head_impl + 8),
                       (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)&testSpec);
            if (testSpec.m_filters.
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (*(code *)((((testSpec.m_filters.
                            super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_patterns).
                          super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi)();
            }
            testSpec.m_filters.
            super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &filename.field_2._M_allocated_capacity);
            clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &tags.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
          }
          peVar3 = local_2f0->_M_ptr;
          std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Catch::Config,void>
                    ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&filename,
                     local_2f0);
          anon_unknown_1::createReporter
                    ((anon_unknown_1 *)&tags,&(peVar3->m_data).reporterName,(IConfigPtr *)&filename)
          ;
          ListeningReporter::addReporter
                    ((ListeningReporter *)
                     this_00.
                     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                     (IStreamingReporterPtr *)&tags);
          if (tags.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(((tags.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
          }
          tags.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        }
        clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&filename._M_string_length);
        std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<Catch::Config,void>
                  ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&tags,__r);
        RunContext::RunContext
                  ((RunContext *)&filename,(IConfigPtr *)&tags,(IStreamingReporterPtr *)&local_2f8);
        clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &tags.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        totals.error = 0;
        totals.assertions.passed = 0;
        totals.assertions.failed = 0;
        totals.assertions.failedButOk = 0;
        totals.testCases.passed = 0;
        totals.testCases.failed = 0;
        totals.testCases.failedButOk = 0;
        (*(__r->_M_ptr->super_IConfig).super_NonCopyable._vptr_NonCopyable[4])(&tags);
        RunContext::testGroupStarting((RunContext *)&filename,(string *)&tags,1,1);
        std::__cxx11::string::~string((string *)&tags);
        iVar6 = (*(__r->_M_ptr->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xc])();
        clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::
        vector(&testSpec.m_filters,
               (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               CONCAT44(extraout_var_01,iVar6));
        pvVar7 = getAllTestCasesSorted(&__r->_M_ptr->super_IConfig);
        pTVar1 = (pvVar7->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pTVar13 = (pvVar7->
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                       _M_impl.super__Vector_impl_data._M_start; pTVar13 != pTVar1;
            pTVar13 = pTVar13 + 1) {
          if (testSpec.m_filters.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              testSpec.m_filters.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            bVar5 = ((pTVar13->super_TestCaseInfo).properties & IsHidden) == None;
          }
          else {
            bVar5 = matchTest(pTVar13,&testSpec,&__r->_M_ptr->super_IConfig);
          }
          iVar6 = (*(local_150->super_NonCopyable)._vptr_NonCopyable[9])();
          if (bVar5 == true && local_130 < (ulong)(long)iVar6) {
            RunContext::runTest((Totals *)&tags,(RunContext *)&filename,pTVar13);
            Totals::operator+=(&totals,(Totals *)&tags);
          }
          else {
            (**(code **)(*(long *)local_108._M_t.
                                  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                  _M_head_impl + 0x80))
                      (local_108._M_t.
                       super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                       pTVar13);
          }
        }
        iVar6 = (*(__r->_M_ptr->super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
        if (((char)iVar6 != '\0') &&
           (totals.testCases.failed + totals.testCases.passed + totals.testCases.failedButOk == 0))
        {
          ReusableStringStream::ReusableStringStream(&testConfig);
          iVar6 = (*(__r->_M_ptr->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])();
          psVar4 = (string *)((undefined8 *)CONCAT44(extraout_var_02,iVar6))[1];
          bVar5 = true;
          for (psVar14 = *(string **)CONCAT44(extraout_var_02,iVar6); psVar14 != psVar4;
              psVar14 = psVar14 + 0x20) {
            if (!bVar5) {
              std::operator<<((ostream *)testConfig.m_oss,' ');
            }
            std::operator<<((ostream *)testConfig.m_oss,psVar14);
            bVar5 = false;
          }
          std::__cxx11::stringbuf::str();
          (**(code **)(*(long *)local_108._M_t.
                                super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                _M_head_impl + 0x18))
                    (local_108._M_t.
                     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,&tags);
          std::__cxx11::string::~string((string *)&tags);
          totals.error = -1;
          ReusableStringStream::~ReusableStringStream(&testConfig);
        }
        (*(__r->_M_ptr->super_IConfig).super_NonCopyable._vptr_NonCopyable[4])(&tags);
        RunContext::testGroupEnded((RunContext *)&filename,(string *)&tags,&totals,1,1);
        std::__cxx11::string::~string((string *)&tags);
        clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::
        ~vector(&testSpec.m_filters);
        RunContext::~RunContext((RunContext *)&filename);
        if ((_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             )local_2f8._M_t.
              super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
              .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl !=
            (IStreamingReporter *)0x0) {
          (**(code **)(*(long *)local_2f8._M_t.
                                super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                _M_head_impl + 8))();
        }
        if ((int)totals.assertions.failed < totals.error) {
          totals.assertions.failed._0_4_ = totals.error;
        }
        if (0xfe < (int)totals.assertions.failed) {
          totals.assertions.failed._0_4_ = 0xff;
        }
      }
      else {
        totals.assertions.failed._0_4_ = *(int *)filename._M_dataplus._M_p;
      }
    }
  }
  else {
    totals.assertions.failed._0_4_ = 1;
  }
  return (int)totals.assertions.failed;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return static_cast<int>( *listed );

            auto totals = runTests( m_config );
            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }